

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

int __thiscall
QStyleSheetStyle::styleHint
          (QStyleSheetStyle *this,StyleHint sh,QStyleOption *opt,QWidget *w,QStyleHintReturn *shret)

{
  bool bVar1;
  BrushStyle BVar2;
  Int IVar3;
  QStyle *pQVar4;
  QWidget *this_00;
  QTabWidget *pQVar5;
  QStyleSheetPositionData *pQVar6;
  QComboBox *pQVar7;
  QAbstractItemView *pQVar8;
  QStyleSheetBorderData *pQVar9;
  QStyleSheetStyle *in_RCX;
  undefined8 in_RDX;
  uint in_ESI;
  QStyleSheetStyle *in_RDI;
  QStyleSheetStyle *in_R8;
  long in_FS_OFFSET;
  QLatin1StringView QVar10;
  QAbstractItemView *view;
  Alignment align;
  QLatin1StringView s;
  QStyleSheetStyleRecursionGuard recursion_guard;
  QRenderRule subRule_1;
  QRenderRule subRule;
  QRenderRule rule;
  QVariant styleHint;
  undefined4 in_stack_fffffffffffff9b8;
  FindChildOption in_stack_fffffffffffff9bc;
  undefined4 in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c4;
  QStyleSheetStyle *in_stack_fffffffffffff9c8;
  undefined5 in_stack_fffffffffffff9d0;
  undefined1 in_stack_fffffffffffff9d5;
  undefined1 in_stack_fffffffffffff9d6;
  byte in_stack_fffffffffffff9d7;
  char *pcVar11;
  int local_5fc;
  Int local_5cc;
  undefined1 *local_5b8;
  char *local_5b0;
  undefined1 *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  char *local_590;
  undefined1 *local_588;
  char *local_580;
  undefined1 *local_578;
  char *local_570;
  undefined1 *local_568;
  char *local_560;
  undefined1 *local_550;
  char *local_548;
  undefined1 *local_540;
  int in_stack_fffffffffffffad4;
  undefined4 in_stack_fffffffffffffad8;
  undefined4 in_stack_fffffffffffffadc;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_520;
  Int local_51c;
  undefined1 in_stack_fffffffffffffae8 [16];
  undefined1 auVar12 [12];
  undefined1 in_stack_fffffffffffffaf8 [16];
  undefined1 *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  undefined1 *local_498;
  char *local_490;
  undefined1 *local_488;
  char *local_480;
  undefined1 *local_478;
  char *local_470;
  undefined1 *local_468;
  char *local_460;
  undefined1 *local_458;
  char *local_450;
  undefined1 *local_448;
  char *local_440;
  undefined1 *local_438;
  char *local_430;
  undefined1 *local_428;
  char *local_420;
  undefined1 *local_418;
  char *local_410;
  undefined1 *local_408;
  char *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  char *local_390;
  undefined1 *local_388;
  char *local_380;
  QLatin1String local_378;
  QStyleSheetStyleRecursionGuard local_361;
  undefined1 local_360 [136];
  undefined1 local_2d8 [440];
  byte local_120;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  auVar12 = in_stack_fffffffffffffae8._4_12_;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((globalStyleSheetStyle != (QStyleSheetStyle *)0x0) && (globalStyleSheetStyle != in_RDI)) {
    pQVar4 = baseStyle(in_stack_fffffffffffff9c8);
    local_5cc = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,in_ESI,in_RDX,in_RCX,in_R8);
    goto LAB_0044010c;
  }
  local_361.guarded = true;
  QStyleSheetStyleRecursionGuard::QStyleSheetStyleRecursionGuard(&local_361,in_RDI);
  if (in_ESI == 0x17) {
    pQVar4 = baseStyle(in_stack_fffffffffffff9c8);
    local_5cc = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x17,in_RDX,in_RCX,in_R8);
  }
  else {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    pcVar11 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
    renderRule(in_stack_fffffffffffffaf8._8_8_,in_stack_fffffffffffffaf8._0_8_,auVar12._4_8_,
               auVar12._0_4_);
    local_378.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_378.m_data = &DAT_aaaaaaaaaaaaaaaa;
    QLatin1String::QLatin1String(&local_378);
    this_00 = (QWidget *)(ulong)in_ESI;
    switch(this_00) {
    case (QWidget *)0x0:
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffff9c8,
                          CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_3b8 = (undefined1 *)QVar10.m_size;
      local_378.m_size = (qsizetype)local_3b8;
      local_3b0 = QVar10.m_data;
      local_378.m_data = local_3b0;
      break;
    case (QWidget *)0x1:
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffff9c8,
                          CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_3a8 = (undefined1 *)QVar10.m_size;
      local_378.m_size = (qsizetype)local_3a8;
      local_3a0 = QVar10.m_data;
      local_378.m_data = local_3a0;
      break;
    case (QWidget *)0x2:
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffff9c8,
                          CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_4e8 = (undefined1 *)QVar10.m_size;
      local_378.m_size = (qsizetype)local_4e8;
      local_4e0 = QVar10.m_data;
      local_378.m_data = local_4e0;
      break;
    case (QWidget *)0x3:
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffff9c8,
                          CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_378.m_size = QVar10.m_size;
      local_378.m_data = QVar10.m_data;
      break;
    default:
      break;
    case (QWidget *)0x5:
      pQVar5 = qobject_cast<QTabWidget_const*>((QObject *)0x43f92e);
      if (pQVar5 != (QTabWidget *)0x0) {
        renderRule(in_stack_fffffffffffffaf8._8_8_,in_stack_fffffffffffffaf8._0_8_,auVar12._4_8_,
                   auVar12._0_4_);
        QRenderRule::operator=
                  ((QRenderRule *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                   (QRenderRule *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
        QRenderRule::~QRenderRule
                  ((QRenderRule *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
        bVar1 = QRenderRule::hasPosition
                          ((QRenderRule *)
                           CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
        if (bVar1) {
          pQVar6 = QRenderRule::position((QRenderRule *)0x43f99c);
          local_5cc = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&pQVar6->position);
          goto LAB_004400f2;
        }
      }
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffff9c8,
                          CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_378.m_size = QVar10.m_size;
      local_378.m_data = QVar10.m_data;
      break;
    case (QWidget *)0x11:
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffff9c8,
                          CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_4b8 = (undefined1 *)QVar10.m_size;
      local_378.m_size = (qsizetype)local_4b8;
      local_4b0 = QVar10.m_data;
      local_378.m_data = local_4b0;
      break;
    case (QWidget *)0x12:
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffff9c8,
                          CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_438 = (undefined1 *)QVar10.m_size;
      local_378.m_size = (qsizetype)local_438;
      local_430 = QVar10.m_data;
      local_378.m_data = local_430;
      break;
    case (QWidget *)0x13:
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffff9c8,
                          CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_428 = (undefined1 *)QVar10.m_size;
      local_378.m_size = (qsizetype)local_428;
      local_420 = QVar10.m_data;
      local_378.m_data = local_420;
      break;
    case (QWidget *)0x15:
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffff9c8,
                          CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_468 = (undefined1 *)QVar10.m_size;
      local_378.m_size = (qsizetype)local_468;
      local_460 = QVar10.m_data;
      local_378.m_data = local_460;
      break;
    case (QWidget *)0x18:
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffff9c8,
                          CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_578 = (undefined1 *)QVar10.m_size;
      local_378.m_size = (qsizetype)local_578;
      local_570 = QVar10.m_data;
      local_378.m_data = local_570;
      break;
    case (QWidget *)0x19:
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffff9c8,
                          CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_418 = (undefined1 *)QVar10.m_size;
      local_378.m_size = (qsizetype)local_418;
      local_410 = QVar10.m_data;
      local_378.m_data = local_410;
      break;
    case (QWidget *)0x1a:
      bVar1 = QRenderRule::hasBorder
                        ((QRenderRule *)
                         CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      if (!bVar1) break;
      pQVar9 = QRenderRule::border((QRenderRule *)0x43fdb3);
      local_5cc = (Int)((pQVar9->borders[3] != 0 ^ 0xffU) & 1);
      goto LAB_004400f2;
    case (QWidget *)0x1e:
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffff9c8,
                          CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_448 = (undefined1 *)QVar10.m_size;
      local_378.m_size = (qsizetype)local_448;
      local_440 = QVar10.m_data;
      local_378.m_data = local_440;
      break;
    case (QWidget *)0x20:
      bVar1 = QRenderRule::hasPalette
                        ((QRenderRule *)
                         CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      if (bVar1) {
        QRenderRule::palette((QRenderRule *)0x43f738);
        BVar2 = QBrush::style((QBrush *)0x43f744);
        if (BVar2 != NoBrush) {
          QRenderRule::palette((QRenderRule *)0x43f756);
          QBrush::color((QBrush *)0x43f762);
          local_5cc = QColor::rgba();
          goto LAB_004400f2;
        }
      }
      break;
    case (QWidget *)0x22:
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffff9c8,
                          CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_3e8 = (undefined1 *)QVar10.m_size;
      local_378.m_size = (qsizetype)local_3e8;
      local_3e0 = QVar10.m_data;
      local_378.m_data = local_3e0;
      break;
    case (QWidget *)0x23:
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffff9c8,
                          CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_388 = (undefined1 *)QVar10.m_size;
      local_378.m_size = (qsizetype)local_388;
      local_380 = QVar10.m_data;
      local_378.m_data = local_380;
      break;
    case (QWidget *)0x25:
      renderRule(in_stack_fffffffffffffaf8._8_8_,in_stack_fffffffffffffaf8._0_8_,auVar12._4_8_,
                 auVar12._0_4_);
      QRenderRule::~QRenderRule
                ((QRenderRule *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      in_stack_fffffffffffff9d7 = local_120;
      if ((local_120 & 1) != 0) {
        local_5cc = 0;
        goto LAB_004400f2;
      }
      break;
    case (QWidget *)0x26:
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffff9c8,
                          CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_550 = (undefined1 *)QVar10.m_size;
      local_378.m_size = (qsizetype)local_550;
      local_548 = QVar10.m_data;
      local_378.m_data = local_548;
      break;
    case (QWidget *)0x27:
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffff9c8,
                          CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_4d8 = (undefined1 *)QVar10.m_size;
      local_378.m_size = (qsizetype)local_4d8;
      local_4d0 = QVar10.m_data;
      local_378.m_data = local_4d0;
      break;
    case (QWidget *)0x2c:
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffff9c8,
                          CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_478 = (undefined1 *)QVar10.m_size;
      local_378.m_size = (qsizetype)local_478;
      local_470 = QVar10.m_data;
      local_378.m_data = local_470;
      break;
    case (QWidget *)0x2e:
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffff9c8,
                          CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_408 = (undefined1 *)QVar10.m_size;
      local_378.m_size = (qsizetype)local_408;
      local_400 = QVar10.m_data;
      local_378.m_data = local_400;
      break;
    case (QWidget *)0x2f:
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffff9c8,
                          CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_458 = (undefined1 *)QVar10.m_size;
      local_378.m_size = (qsizetype)local_458;
      local_450 = QVar10.m_data;
      local_378.m_data = local_450;
      break;
    case (QWidget *)0x33:
      memset(local_360,0xaa,0x88);
      renderRule(in_stack_fffffffffffffaf8._8_8_,in_stack_fffffffffffffaf8._0_8_,auVar12._4_8_,
                 auVar12._0_4_);
      bVar1 = QRenderRule::hasDrawable
                        ((QRenderRule *)
                         CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      if (bVar1) {
        local_5cc = 1;
        local_5fc = 1;
      }
      else {
        local_5fc = 2;
      }
      QRenderRule::~QRenderRule
                ((QRenderRule *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      if (local_5fc != 2) goto LAB_004400f2;
      break;
    case (QWidget *)0x34:
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffff9c8,
                          CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_4a8 = (undefined1 *)QVar10.m_size;
      local_378.m_size = (qsizetype)local_4a8;
      local_4a0 = QVar10.m_data;
      local_378.m_data = local_4a0;
      break;
    case (QWidget *)0x38:
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffff9c8,
                          CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_488 = (undefined1 *)QVar10.m_size;
      local_378.m_size = (qsizetype)local_488;
      local_480 = QVar10.m_data;
      local_378.m_data = local_480;
      break;
    case (QWidget *)0x3c:
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffff9c8,
                          CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_3d8 = (undefined1 *)QVar10.m_size;
      local_378.m_size = (qsizetype)local_3d8;
      local_3d0 = QVar10.m_data;
      local_378.m_data = local_3d0;
      break;
    case (QWidget *)0x3d:
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffff9c8,
                          CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_3c8 = (undefined1 *)QVar10.m_size;
      local_378.m_size = (qsizetype)local_3c8;
      local_3c0 = QVar10.m_data;
      local_378.m_data = local_3c0;
      break;
    case (QWidget *)0x3e:
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffff9c8,
                          CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_4c8 = (undefined1 *)QVar10.m_size;
      local_378.m_size = (qsizetype)local_4c8;
      local_4c0 = QVar10.m_data;
      local_378.m_data = local_4c0;
      break;
    case (QWidget *)0x3f:
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffff9c8,
                          CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_4f8 = (undefined1 *)QVar10.m_size;
      local_378.m_size = (qsizetype)local_4f8;
      local_4f0 = QVar10.m_data;
      local_378.m_data = local_4f0;
      break;
    case (QWidget *)0x43:
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffff9c8,
                          CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_540 = (undefined1 *)QVar10.m_size;
      local_378.m_size = (qsizetype)local_540;
      local_378.m_data = QVar10.m_data;
      break;
    case (QWidget *)0x44:
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffff9c8,
                          CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_3f8 = (undefined1 *)QVar10.m_size;
      local_378.m_size = (qsizetype)local_3f8;
      local_3f0 = QVar10.m_data;
      local_378.m_data = local_3f0;
      break;
    case (QWidget *)0x45:
      pQVar7 = qobject_cast<QComboBox_const*>((QObject *)0x43fc20);
      if (pQVar7 != (QComboBox *)0x0) {
        in_stack_fffffffffffff9c8 = in_RCX;
        QFlags<Qt::FindChildOption>::QFlags
                  ((QFlags<Qt::FindChildOption> *)
                   CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                   in_stack_fffffffffffff9bc);
        pQVar8 = QObject::findChild<QAbstractItemView*>
                           ((QObject *)in_stack_fffffffffffff9c8,
                            (QFlagsStorageHelper<Qt::FindChildOption,_4>)
                            SUB84((ulong)this_00 >> 0x20,0));
        if (pQVar8 != (QAbstractItemView *)0x0) {
          QWidget::ensurePolished(this_00);
          memset(local_2d8,0xaa,0x88);
          renderRule(in_R8,(QObject *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                     in_stack_fffffffffffffad4,(quint64)local_540);
          bVar1 = QRenderRule::hasBox((QRenderRule *)
                                      CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0))
          ;
          if ((bVar1) ||
             (bVar1 = QRenderRule::hasNativeBorder
                                ((QRenderRule *)
                                 CONCAT17(in_stack_fffffffffffff9d7,
                                          CONCAT16(in_stack_fffffffffffff9d6,
                                                   CONCAT15(in_stack_fffffffffffff9d5,
                                                            in_stack_fffffffffffff9d0)))), !bVar1))
          {
            local_5cc = 0;
            bVar1 = true;
          }
          else {
            bVar1 = false;
          }
          QRenderRule::~QRenderRule
                    ((QRenderRule *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
          if (bVar1) goto LAB_004400f2;
        }
      }
      break;
    case (QWidget *)0x46:
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffff9c8,
                          CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_498 = (undefined1 *)QVar10.m_size;
      local_378.m_size = (qsizetype)local_498;
      local_490 = QVar10.m_data;
      local_378.m_data = local_490;
      break;
    case (QWidget *)0x47:
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffff9c8,
                          CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_568 = (undefined1 *)QVar10.m_size;
      local_378.m_size = (qsizetype)local_568;
      local_560 = QVar10.m_data;
      local_378.m_data = local_560;
      break;
    case (QWidget *)0x4f:
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffff9c8,
                          CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_588 = (undefined1 *)QVar10.m_size;
      local_378.m_size = (qsizetype)local_588;
      local_580 = QVar10.m_data;
      local_378.m_data = local_580;
      break;
    case (QWidget *)0x54:
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffff9c8,
                          CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_598 = (undefined1 *)QVar10.m_size;
      local_378.m_size = (qsizetype)local_598;
      local_590 = QVar10.m_data;
      local_378.m_data = local_590;
      break;
    case (QWidget *)0x5c:
      renderRule(in_stack_fffffffffffffaf8._8_8_,in_stack_fffffffffffffaf8._0_8_,auVar12._4_8_,
                 auVar12._0_4_);
      QRenderRule::operator=
                ((QRenderRule *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                 (QRenderRule *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
      QRenderRule::~QRenderRule
                ((QRenderRule *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      bVar1 = QRenderRule::hasPosition
                        ((QRenderRule *)
                         CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      if (bVar1) {
        local_51c = 0xaaaaaaaa;
        pQVar6 = QRenderRule::position((QRenderRule *)0x43fa75);
        local_51c = (pQVar6->position).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                    super_QFlagsStorage<Qt::AlignmentFlag>.i;
        local_520.super_QFlagsStorage<Qt::AlignmentFlag>.i =
             (QFlagsStorage<Qt::AlignmentFlag>)
             QFlags<Qt::AlignmentFlag>::operator&
                       ((QFlags<Qt::AlignmentFlag> *)
                        CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                        in_stack_fffffffffffff9bc);
        IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_520);
        in_stack_fffffffffffff9d6 = true;
        if (IVar3 == 0) {
          QFlags<Qt::AlignmentFlag>::operator&
                    ((QFlags<Qt::AlignmentFlag> *)
                     CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                     in_stack_fffffffffffff9bc);
          IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xfffffffffffffadc);
          in_stack_fffffffffffff9d6 = IVar3 != 0;
        }
        if ((bool)in_stack_fffffffffffff9d6 == false) {
          QFlags<Qt::AlignmentFlag>::operator&
                    ((QFlags<Qt::AlignmentFlag> *)
                     CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                     in_stack_fffffffffffff9bc);
          IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xfffffffffffffad8);
          bVar1 = true;
          if (IVar3 == 0) {
            QFlags<Qt::AlignmentFlag>::operator&
                      ((QFlags<Qt::AlignmentFlag> *)
                       CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                       in_stack_fffffffffffff9bc);
            IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xfffffffffffffad4);
            bVar1 = IVar3 != 0;
          }
          if (!bVar1) {
            in_stack_fffffffffffff9d5 = 0;
            break;
          }
          local_5cc = 1;
        }
        else {
          local_5cc = 0;
        }
        goto LAB_004400f2;
      }
      break;
    case (QWidget *)0x60:
      bVar1 = QRenderRule::hasNativeBorder
                        ((QRenderRule *)
                         CONCAT17(in_stack_fffffffffffff9d7,
                                  CONCAT16(in_stack_fffffffffffff9d6,
                                           CONCAT15(in_stack_fffffffffffff9d5,
                                                    in_stack_fffffffffffff9d0))));
      if (((!bVar1) ||
          (bVar1 = QRenderRule::hasBox((QRenderRule *)
                                       CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0)
                                      ), bVar1)) ||
         (bVar1 = QRenderRule::hasDrawable
                            ((QRenderRule *)
                             CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0)), bVar1))
      {
        local_5cc = 0;
        goto LAB_004400f2;
      }
      break;
    case (QWidget *)0x67:
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffff9c8,
                          CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_398 = (undefined1 *)QVar10.m_size;
      local_378.m_size = (qsizetype)local_398;
      local_390 = QVar10.m_data;
      local_378.m_data = local_390;
      break;
    case (QWidget *)0x70:
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffff9c8,
                          CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_5a8 = (undefined1 *)QVar10.m_size;
      local_378.m_size = (qsizetype)local_5a8;
      local_5a0 = QVar10.m_data;
      local_378.m_data = local_5a0;
      break;
    case (QWidget *)0x71:
      QVar10 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)in_stack_fffffffffffff9c8,
                          CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      local_5b8 = (undefined1 *)QVar10.m_size;
      local_378.m_size = (qsizetype)local_5b8;
      local_5b0 = QVar10.m_data;
      local_378.m_data = local_5b0;
    }
    bVar1 = QLatin1String::isEmpty((QLatin1String *)0x43ffce);
    if (bVar1) {
LAB_004400bd:
      pQVar4 = baseStyle(in_stack_fffffffffffff9c8);
      local_5cc = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,in_ESI,in_RDX,in_RCX,in_R8);
    }
    else {
      local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QVar10.m_size._5_1_ = in_stack_fffffffffffff9d5;
      QVar10.m_size._0_5_ = in_stack_fffffffffffff9d0;
      QVar10.m_size._6_1_ = in_stack_fffffffffffff9d6;
      QVar10.m_size._7_1_ = in_stack_fffffffffffff9d7;
      QVar10.m_data = pcVar11;
      QRenderRule::styleHint
                ((QRenderRule *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),QVar10
                );
      bVar1 = ::QVariant::isValid((QVariant *)
                                  CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      if ((bVar1) &&
         (bVar1 = ::QVariant::canConvert<int>
                            ((QVariant *)
                             CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0)), bVar1))
      {
        local_5cc = ::QVariant::toInt((bool *)local_28.data);
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
      ::QVariant::~QVariant((QVariant *)&local_28);
      if (!bVar1) goto LAB_004400bd;
    }
LAB_004400f2:
    QRenderRule::~QRenderRule
              ((QRenderRule *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
  }
  QStyleSheetStyleRecursionGuard::~QStyleSheetStyleRecursionGuard(&local_361);
LAB_0044010c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_5cc;
  }
  __stack_chk_fail();
}

Assistant:

int QStyleSheetStyle::styleHint(StyleHint sh, const QStyleOption *opt, const QWidget *w,
                           QStyleHintReturn *shret) const
{
    RECURSION_GUARD(return baseStyle()->styleHint(sh, opt, w, shret))
    // Prevent endless loop if somebody use isActiveWindow property as selector.
    // QWidget::isActiveWindow uses this styleHint to determine if the window is active or not
    if (sh == SH_Widget_ShareActivation)
        return baseStyle()->styleHint(sh, opt, w, shret);

    QRenderRule rule = renderRule(w, opt);
    QLatin1StringView s;
    switch (sh) {
        case SH_LineEdit_PasswordCharacter: s = "lineedit-password-character"_L1; break;
        case SH_LineEdit_PasswordMaskDelay: s = "lineedit-password-mask-delay"_L1; break;
        case SH_DitherDisabledText: s = "dither-disabled-text"_L1; break;
        case SH_EtchDisabledText: s = "etch-disabled-text"_L1; break;
        case SH_ItemView_ActivateItemOnSingleClick: s = "activate-on-singleclick"_L1; break;
        case SH_ItemView_ShowDecorationSelected: s = "show-decoration-selected"_L1; break;
        case SH_Table_GridLineColor: s = "gridline-color"_L1; break;
        case SH_DialogButtonLayout: s = "button-layout"_L1; break;
        case SH_ToolTipLabel_Opacity: s = "opacity"_L1; break;
        case SH_ComboBox_Popup: s = "combobox-popup"_L1; break;
        case SH_ComboBox_ListMouseTracking: s = "combobox-list-mousetracking"_L1; break;
        case SH_MenuBar_AltKeyNavigation: s = "menubar-altkey-navigation"_L1; break;
        case SH_Menu_Scrollable: s = "menu-scrollable"_L1; break;
        case SH_DrawMenuBarSeparator: s = "menubar-separator"_L1; break;
        case SH_MenuBar_MouseTracking: s = "mouse-tracking"_L1; break;
        case SH_SpinBox_ClickAutoRepeatRate: s = "spinbox-click-autorepeat-rate"_L1; break;
        case SH_SpinControls_DisableOnBounds: s = "spincontrol-disable-on-bounds"_L1; break;
        case SH_MessageBox_TextInteractionFlags: s = "messagebox-text-interaction-flags"_L1; break;
        case SH_ToolButton_PopupDelay: s = "toolbutton-popup-delay"_L1; break;
        case SH_ToolBox_SelectedPageTitleBold:
            if (renderRule(w, opt, PseudoElement_ToolBoxTab).hasFont)
                return 0;
            break;
        case SH_GroupBox_TextLabelColor:
            if (rule.hasPalette() && rule.palette()->foreground.style() != Qt::NoBrush)
                return rule.palette()->foreground.color().rgba();
            break;
        case SH_ScrollView_FrameOnlyAroundContents: s = "scrollview-frame-around-contents"_L1; break;
        case SH_ScrollBar_ContextMenu: s = "scrollbar-contextmenu"_L1; break;
        case SH_ScrollBar_LeftClickAbsolutePosition: s = "scrollbar-leftclick-absolute-position"_L1; break;
        case SH_ScrollBar_MiddleClickAbsolutePosition: s = "scrollbar-middleclick-absolute-position"_L1; break;
        case SH_ScrollBar_RollBetweenButtons: s = "scrollbar-roll-between-buttons"_L1; break;
        case SH_ScrollBar_ScrollWhenPointerLeavesControl: s = "scrollbar-scroll-when-pointer-leaves-control"_L1; break;
        case SH_TabBar_Alignment:
#if QT_CONFIG(tabwidget)
            if (qobject_cast<const QTabWidget *>(w)) {
                rule = renderRule(w, opt, PseudoElement_TabWidgetTabBar);
                if (rule.hasPosition())
                    return rule.position()->position;
            }
#endif // QT_CONFIG(tabwidget)
            s = "alignment"_L1;
            break;
#if QT_CONFIG(tabbar)
        case SH_TabBar_CloseButtonPosition:
            rule = renderRule(w, opt, PseudoElement_TabBarTabCloseButton);
            if (rule.hasPosition()) {
                Qt::Alignment align = rule.position()->position;
                if (align & Qt::AlignLeft || align & Qt::AlignTop)
                    return QTabBar::LeftSide;
                if (align & Qt::AlignRight || align & Qt::AlignBottom)
                    return QTabBar::RightSide;
            }
            break;
#endif
        case SH_TabBar_ElideMode: s = "tabbar-elide-mode"_L1; break;
        case SH_TabBar_PreferNoArrows: s = "tabbar-prefer-no-arrows"_L1; break;
        case SH_ComboBox_PopupFrameStyle:
#if QT_CONFIG(combobox)
            if (qobject_cast<const QComboBox *>(w)) {
                QAbstractItemView *view = w->findChild<QAbstractItemView *>();
                if (view) {
                    view->ensurePolished();
                    QRenderRule subRule = renderRule(view, PseudoElement_None);
                    if (subRule.hasBox() || !subRule.hasNativeBorder())
                        return QFrame::NoFrame;
                }
            }
#endif // QT_CONFIG(combobox)
            break;
        case SH_DialogButtonBox_ButtonsHaveIcons: s = "dialogbuttonbox-buttons-have-icons"_L1; break;
        case SH_Workspace_FillSpaceOnMaximize: s = "mdi-fill-space-on-maximize"_L1; break;
        case SH_TitleBar_NoBorder:
            if (rule.hasBorder())
                return !rule.border()->borders[LeftEdge];
            break;
        case SH_TitleBar_AutoRaise: { // plain absurd
            QRenderRule subRule = renderRule(w, opt, PseudoElement_TitleBar);
            if (subRule.hasDrawable())
                return 1;
            break;
                                   }
        case SH_ItemView_ArrowKeysNavigateIntoChildren: s = "arrow-keys-navigate-into-children"_L1; break;
        case SH_ItemView_PaintAlternatingRowColorsForEmptyArea: s = "paint-alternating-row-colors-for-empty-area"_L1; break;
        case SH_TitleBar_ShowToolTipsOnButtons: s = "titlebar-show-tooltips-on-buttons"_L1; break;
        case SH_Widget_Animation_Duration: s = "widget-animation-duration"_L1; break;
        case SH_ScrollBar_Transient:
            if (!rule.hasNativeBorder() || rule.hasBox() || rule.hasDrawable())
                return 0;
            break;
        default: break;
    }
    if (!s.isEmpty()) {
        const auto styleHint = rule.styleHint(s);
        if (styleHint.isValid() && styleHint.canConvert<int>())
            return styleHint.toInt();
    }

    return baseStyle()->styleHint(sh, opt, w, shret);
}